

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::ContainsType
          (ValidationState_t *this,uint32_t id,
          function<bool_(const_spvtools::val::Instruction_*)> *f,bool traverse_all_types)

{
  ushort uVar1;
  Instruction *this_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  const_iterator cVar5;
  ulong uVar6;
  const_iterator cVar7;
  size_t index;
  Instruction *local_30;
  
  local_30 = (Instruction *)CONCAT44(local_30._4_4_,id);
  cVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,(key_type_conflict *)&local_30);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    return false;
  }
  this_00 = *(Instruction **)
             ((long)cVar5.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                    ._M_cur + 0x10);
  if (this_00 == (Instruction *)0x0) {
    return false;
  }
  local_30 = this_00;
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar3 = (*f->_M_invoker)((_Any_data *)f,&local_30);
  if (bVar3) {
    return true;
  }
  uVar1 = (this_00->inst_).opcode;
  uVar6 = (ulong)uVar1;
  if (uVar6 < 0x22) {
    if ((0x3b800000UL >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x240000000U >> (uVar6 & 0x3f) & 1) != 0) {
        if (uVar1 == 0x21 && !traverse_all_types) {
          return false;
        }
        if ((ulong)((long)(this_00->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
          return false;
        }
        index = 1;
        uVar6 = 2;
        do {
          uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,index);
          bVar3 = ContainsType(this,uVar4,f,traverse_all_types);
          if (bVar3) {
            return bVar3;
          }
          bVar2 = uVar6 < (ulong)((long)(this_00->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4);
          index = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar2);
        return bVar3;
      }
      if (uVar6 == 0x20) {
        local_30 = (Instruction *)CONCAT44(local_30._4_4_,id);
        cVar7 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->forward_pointer_ids_)._M_h,(key_type_conflict *)&local_30);
        if (!traverse_all_types ||
            cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
          return false;
        }
        uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
        traverse_all_types = true;
        goto LAB_0020b2d9;
      }
      goto LAB_0020b3a1;
    }
  }
  else {
LAB_0020b3a1:
    if ((uVar1 != 0x14ee) && (uVar1 != 0x1168)) {
      return false;
    }
  }
  uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,1);
LAB_0020b2d9:
  bVar3 = ContainsType(this,uVar4,f,traverse_all_types);
  return bVar3;
}

Assistant:

bool ValidationState_t::ContainsType(
    uint32_t id, const std::function<bool(const Instruction*)>& f,
    bool traverse_all_types) const {
  const auto inst = FindDef(id);
  if (!inst) return false;

  if (f(inst)) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return ContainsType(inst->GetOperandAs<uint32_t>(1u), f,
                          traverse_all_types);
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      if (traverse_all_types) {
        return ContainsType(inst->GetOperandAs<uint32_t>(2u), f,
                            traverse_all_types);
      }
      break;
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct:
      if (inst->opcode() == spv::Op::OpTypeFunction && !traverse_all_types) {
        return false;
      }
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsType(inst->GetOperandAs<uint32_t>(i), f,
                         traverse_all_types)) {
          return true;
        }
      }
      break;
    default:
      break;
  }

  return false;
}